

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O3

void UA_Subscription_publishCallback(UA_Server *server,UA_Subscription *sub)

{
  uint uVar1;
  UA_PublishResponseEntry *__ptr;
  UA_PublishResponseEntry *pUVar2;
  MonitoredItem_queuedValue *pMVar3;
  ulong uVar4;
  MonitoredItem_queuedValue *pMVar5;
  MonitoredItem_queuedValue **ppMVar6;
  UA_NotificationMessageEntry *pUVar7;
  UA_NotificationMessageEntry *pUVar8;
  UA_NotificationMessageEntry **ppUVar9;
  size_t size;
  UA_StatusCode *p;
  UA_DateTime UVar10;
  bool bVar11;
  bool bVar12;
  anon_struct_16_2_4dd83919_for_listEntry *paVar13;
  undefined4 uVar14;
  UA_UInt32 UVar15;
  uint uVar16;
  UA_MonitoredItem *pUVar17;
  UA_NotificationMessage *p_00;
  UA_NotificationMessageEntry *pUVar18;
  UA_ExtensionObject *pUVar19;
  ulong *puVar20;
  void *pvVar21;
  MonitoredItem_queuedValue *pMVar22;
  UA_UInt32 *pUVar23;
  long lVar24;
  long lVar25;
  UA_UInt32 *pUVar26;
  UA_DataValue *pUVar27;
  MonitoredItem_queuedValue ***pppMVar28;
  undefined8 *puVar29;
  UA_Logger logger;
  ulong uVar30;
  UA_Session *pUVar31;
  UA_SecureChannel *pUVar32;
  ulong uVar33;
  byte bVar34;
  undefined1 local_88 [8];
  timeval tv;
  
  bVar34 = 0;
  pUVar26 = (UA_UInt32 *)local_88;
  pUVar31 = sub->session;
  pUVar32 = pUVar31->channel;
  if ((sub->publishingEnabled == true) &&
     (pUVar17 = (sub->monitoredItems).lh_first, pUVar17 != (UA_MonitoredItem *)0x0)) {
    bVar11 = false;
    uVar33 = 0;
    do {
      pMVar22 = (pUVar17->queue).tqh_first;
      if (pMVar22 != (MonitoredItem_queuedValue *)0x0) {
        uVar30 = (ulong)sub->notificationsPerPublish;
        if (sub->notificationsPerPublish < uVar33) {
          uVar30 = uVar33;
        }
        do {
          if (uVar30 == uVar33) {
            bVar11 = true;
            uVar33 = uVar30;
            break;
          }
          uVar33 = uVar33 + 1;
          pMVar22 = (pMVar22->listEntry).tqe_next;
        } while (pMVar22 != (MonitoredItem_queuedValue *)0x0);
      }
      pUVar17 = (pUVar17->listEntry).le_next;
    } while (pUVar17 != (UA_MonitoredItem *)0x0);
    if (uVar33 == 0) goto LAB_0012416c;
    bVar12 = false;
  }
  else {
    bVar11 = false;
LAB_0012416c:
    uVar16 = sub->currentKeepAliveCount + 1;
    sub->currentKeepAliveCount = uVar16;
    if (uVar16 < sub->maxKeepAliveCount) {
      return;
    }
    bVar12 = true;
    uVar33 = 0;
  }
  if (pUVar32 == (UA_SecureChannel *)0x0) {
    return;
  }
  __ptr = (pUVar31->responseQueue).sqh_first;
  if (__ptr == (UA_PublishResponseEntry *)0x0) {
    if (sub->state != UA_SUBSCRIPTIONSTATE_LATE) {
      sub->state = UA_SUBSCRIPTIONSTATE_LATE;
      return;
    }
    uVar16 = sub->currentLifetimeCount + 1;
    sub->currentLifetimeCount = uVar16;
    if (uVar16 <= sub->lifeTimeCount) {
      return;
    }
    UA_Session_deleteSubscription(server,pUVar31,sub->subscriptionID);
    return;
  }
  p_00 = &(__ptr->response).notificationMessage;
  if (bVar12) {
    pUVar18 = (UA_NotificationMessageEntry *)0x0;
LAB_001241bf:
    pUVar31 = sub->session;
    pUVar2 = (((pUVar31->responseQueue).sqh_first)->listEntry).sqe_next;
    (pUVar31->responseQueue).sqh_first = pUVar2;
    if (pUVar2 == (UA_PublishResponseEntry *)0x0) {
      (pUVar31->responseQueue).sqh_last = &(pUVar31->responseQueue).sqh_first;
    }
    gettimeofday((timeval *)local_88,(__timezone_ptr_t)0x0);
    lVar24 = (long)local_88 * 10000000 + tv.tv_sec * 10 + 0x19db1ded53e8000;
    (__ptr->response).responseHeader.timestamp = lVar24;
    (__ptr->response).subscriptionId = sub->subscriptionID;
    (__ptr->response).moreNotifications = bVar11;
    (__ptr->response).notificationMessage.publishTime = lVar24;
    UVar15 = sub->sequenceNumber + 1;
    if (bVar12) {
      p_00->sequenceNumber = UVar15;
      uVar16 = sub->retransmissionQueueSize;
    }
    else {
      sub->sequenceNumber = UVar15;
      p_00->sequenceNumber = UVar15;
      pUVar19 = (__ptr->response).notificationMessage.notificationData;
      (pUVar18->message).notificationDataSize =
           (__ptr->response).notificationMessage.notificationDataSize;
      (pUVar18->message).notificationData = pUVar19;
      uVar14 = *(undefined4 *)&p_00->field_0x4;
      UVar10 = (__ptr->response).notificationMessage.publishTime;
      (pUVar18->message).sequenceNumber = p_00->sequenceNumber;
      *(undefined4 *)&(pUVar18->message).field_0x4 = uVar14;
      (pUVar18->message).publishTime = UVar10;
      uVar16 = (server->config).maxRetransmissionQueueSize;
      if ((uVar16 != 0) && (uVar1 = sub->retransmissionQueueSize, uVar16 <= uVar1)) {
        pUVar7 = ((sub->retransmissionQueue).tqh_last[1]->listEntry).tqe_next;
        pUVar8 = (pUVar7->listEntry).tqe_next;
        ppUVar9 = (pUVar7->listEntry).tqe_prev;
        paVar13 = &pUVar8->listEntry;
        if (pUVar8 == (UA_NotificationMessageEntry *)0x0) {
          paVar13 = (anon_struct_16_2_4dd83919_for_listEntry *)&sub->retransmissionQueue;
        }
        paVar13->tqe_prev = ppUVar9;
        *ppUVar9 = pUVar8;
        sub->retransmissionQueueSize = uVar1 - 1;
        deleteMembers_noInit(&pUVar7->message,UA_TYPES + 0x22);
        free(pUVar7);
      }
      pUVar7 = (sub->retransmissionQueue).tqh_first;
      (pUVar18->listEntry).tqe_next = pUVar7;
      paVar13 = &pUVar7->listEntry;
      if (pUVar7 == (UA_NotificationMessageEntry *)0x0) {
        paVar13 = (anon_struct_16_2_4dd83919_for_listEntry *)&sub->retransmissionQueue;
      }
      paVar13->tqe_prev = (UA_NotificationMessageEntry **)pUVar18;
      (sub->retransmissionQueue).tqh_first = pUVar18;
      (pUVar18->listEntry).tqe_prev = &(sub->retransmissionQueue).tqh_first;
      uVar16 = sub->retransmissionQueueSize + 1;
      sub->retransmissionQueueSize = uVar16;
    }
    if (uVar16 != 0) {
      pUVar26 = (UA_UInt32 *)(local_88 + -((ulong)uVar16 * 4 + 0xf & 0xfffffffffffffff0));
      (__ptr->response).availableSequenceNumbers = pUVar26;
      (__ptr->response).availableSequenceNumbersSize = (ulong)uVar16;
      pUVar23 = pUVar26;
      for (pUVar18 = (sub->retransmissionQueue).tqh_first;
          pUVar18 != (UA_NotificationMessageEntry *)0x0; pUVar18 = (pUVar18->listEntry).tqe_next) {
        *pUVar23 = (pUVar18->message).sequenceNumber;
        pUVar23 = pUVar23 + 1;
      }
    }
    pUVar32 = sub->session->channel;
    UVar15 = __ptr->requestId;
    pUVar26[-2] = 0x1244e3;
    pUVar26[-1] = 0;
    UA_SecureChannel_sendBinaryMessage(pUVar32,UVar15,&__ptr->response,UA_TYPES + 0x4e);
    sub->state = UA_SUBSCRIPTIONSTATE_NORMAL;
    sub->currentKeepAliveCount = 0;
    sub->currentLifetimeCount = 0;
    size = (__ptr->response).resultsSize;
    p = (__ptr->response).results;
    pUVar26[-2] = 0x12450e;
    pUVar26[-1] = 0;
    UA_Array_delete(p,size,UA_TYPES + 6);
    pUVar26[-2] = 0x124516;
    pUVar26[-1] = 0;
    free(__ptr);
    if (bVar11) {
      pUVar26[-2] = 0x12452c;
      pUVar26[-1] = 0;
      UA_Subscription_publishCallback(server,sub);
    }
    return;
  }
  pUVar18 = (UA_NotificationMessageEntry *)malloc(0x30);
  if (pUVar18 == (UA_NotificationMessageEntry *)0x0) {
    if (pUVar32->connection == (UA_Connection *)0x0) {
      uVar33 = 0;
    }
    else {
      uVar33 = (ulong)(uint)pUVar32->connection->sockfd;
    }
    UA_LOG_WARNING((server->config).logger,UA_LOGCATEGORY_SESSION,
                   "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | Subscription %u | Could not allocate memory for retransmission"
                   ,uVar33,(ulong)(pUVar32->securityToken).channelId,
                   (ulong)(pUVar31->sessionId).identifier.numeric,
                   (ulong)(pUVar31->sessionId).identifier.guid.data2,
                   (ulong)(pUVar31->sessionId).identifier.guid.data3,
                   (ulong)(pUVar31->sessionId).identifier.guid.data4[0],
                   (ulong)(pUVar31->sessionId).identifier.guid.data4[1],
                   (ulong)(pUVar31->sessionId).identifier.guid.data4[2],
                   (ulong)(pUVar31->sessionId).identifier.guid.data4[3],
                   (ulong)(pUVar31->sessionId).identifier.guid.data4[4],
                   (ulong)(pUVar31->sessionId).identifier.guid.data4[5],
                   (ulong)(pUVar31->sessionId).identifier.guid.data4[6],
                   (ulong)(pUVar31->sessionId).identifier.guid.data4[7],(ulong)sub->subscriptionID);
    return;
  }
  pUVar19 = (UA_ExtensionObject *)calloc(1,0x30);
  (__ptr->response).notificationMessage.notificationData = pUVar19;
  if (pUVar19 == (UA_ExtensionObject *)0x0) {
    logger = (server->config).logger;
  }
  else {
    (__ptr->response).notificationMessage.notificationDataSize = 1;
    puVar20 = (ulong *)calloc(1,0x20);
    if (puVar20 != (ulong *)0x0) {
      pUVar19->encoding = UA_EXTENSIONOBJECT_DECODED;
      (pUVar19->content).decoded.data = puVar20;
      (pUVar19->content).decoded.type = (UA_DataType *)0x13f8e0;
      pvVar21 = calloc(uVar33,0x68);
      puVar20[1] = (ulong)pvVar21;
      if (pvVar21 != (void *)0x0) {
        *puVar20 = uVar33;
        pUVar17 = (sub->monitoredItems).lh_first;
        if (pUVar17 != (UA_MonitoredItem *)0x0) {
          uVar30 = 0;
          do {
            pMVar22 = (pUVar17->queue).tqh_first;
            if (pMVar22 != (MonitoredItem_queuedValue *)0x0) {
              tv.tv_usec = (__suseconds_t)&(pUVar17->queue).tqh_last;
              lVar24 = uVar30 * 0x68 + 8;
              do {
                if (uVar33 <= uVar30) goto LAB_001241bf;
                pMVar3 = (pMVar22->listEntry).tqe_next;
                uVar4 = puVar20[1];
                *(UA_UInt32 *)((uVar4 - 8) + lVar24) = pMVar22->clientHandle;
                pUVar27 = &pMVar22->value;
                puVar29 = (undefined8 *)(uVar4 + lVar24);
                for (lVar25 = 0xc; lVar25 != 0; lVar25 = lVar25 + -1) {
                  *puVar29 = *(undefined8 *)pUVar27;
                  pUVar27 = (UA_DataValue *)((long)pUVar27 + ((ulong)bVar34 * -2 + 1) * 8);
                  puVar29 = puVar29 + (ulong)bVar34 * -2 + 1;
                }
                pMVar5 = (pMVar22->listEntry).tqe_next;
                ppMVar6 = (pMVar22->listEntry).tqe_prev;
                pppMVar28 = &(pMVar5->listEntry).tqe_prev;
                if (pMVar5 == (MonitoredItem_queuedValue *)0x0) {
                  pppMVar28 = (MonitoredItem_queuedValue ***)tv.tv_usec;
                }
                *pppMVar28 = ppMVar6;
                *ppMVar6 = pMVar5;
                free(pMVar22);
                pUVar17->currentQueueSize = pUVar17->currentQueueSize - 1;
                uVar30 = uVar30 + 1;
                lVar24 = lVar24 + 0x68;
                pMVar22 = pMVar3;
              } while (pMVar3 != (MonitoredItem_queuedValue *)0x0);
            }
            pUVar17 = (pUVar17->listEntry).le_next;
          } while (pUVar17 != (UA_MonitoredItem *)0x0);
        }
        goto LAB_001241bf;
      }
    }
    deleteMembers_noInit(p_00,UA_TYPES + 0x22);
    (__ptr->response).notificationMessage.notificationDataSize = 0;
    (__ptr->response).notificationMessage.notificationData = (UA_ExtensionObject *)0x0;
    *(undefined8 *)p_00 = 0;
    (__ptr->response).notificationMessage.publishTime = 0;
    pUVar31 = sub->session;
    pUVar32 = pUVar31->channel;
    logger = (server->config).logger;
    if (pUVar32 == (UA_SecureChannel *)0x0) {
      uVar33 = 0;
      uVar30 = 0;
      goto LAB_001245b7;
    }
  }
  if (pUVar32->connection == (UA_Connection *)0x0) {
    uVar33 = 0;
  }
  else {
    uVar33 = (ulong)(uint)pUVar32->connection->sockfd;
  }
  uVar30 = (ulong)(pUVar32->securityToken).channelId;
LAB_001245b7:
  UA_LOG_WARNING(logger,UA_LOGCATEGORY_SESSION,
                 "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | Subscription %u | Could not prepare the notification message"
                 ,uVar33,uVar30,(ulong)(pUVar31->sessionId).identifier.numeric,
                 (ulong)(pUVar31->sessionId).identifier.guid.data2,
                 (ulong)(pUVar31->sessionId).identifier.guid.data3,
                 (ulong)(pUVar31->sessionId).identifier.guid.data4[0],
                 (ulong)(pUVar31->sessionId).identifier.guid.data4[1],
                 (ulong)(pUVar31->sessionId).identifier.guid.data4[2],
                 (ulong)(pUVar31->sessionId).identifier.guid.data4[3],
                 (ulong)(pUVar31->sessionId).identifier.guid.data4[4],
                 (ulong)(pUVar31->sessionId).identifier.guid.data4[5],
                 (ulong)(pUVar31->sessionId).identifier.guid.data4[6],
                 (ulong)(pUVar31->sessionId).identifier.guid.data4[7],(ulong)sub->subscriptionID);
  free(pUVar18);
  return;
}

Assistant:

void UA_Subscription_publishCallback(UA_Server *server, UA_Subscription *sub) {
    UA_LOG_DEBUG_SESSION(server->config.logger, sub->session, "Subscription %u | "
                         "Publish Callback", sub->subscriptionID);

    /* Count the available notifications */
    UA_Boolean moreNotifications = false;
    size_t notifications = countQueuedNotifications(sub, &moreNotifications);

    /* Return if nothing to do */
    if(notifications == 0) {
        ++sub->currentKeepAliveCount;
        if(sub->currentKeepAliveCount < sub->maxKeepAliveCount)
            return;
        UA_LOG_DEBUG_SESSION(server->config.logger, sub->session,
                             "Subscription %u | Sending a KeepAlive",
                             sub->subscriptionID)
    }

    /* Check if the securechannel is valid */
    UA_SecureChannel *channel = sub->session->channel;
    if(!channel)
        return;

    /* Dequeue a response */
    UA_PublishResponseEntry *pre = SIMPLEQ_FIRST(&sub->session->responseQueue);

    /* Cannot publish without a response */
    if(!pre) {
        UA_LOG_DEBUG_SESSION(server->config.logger, sub->session,
                             "Subscription %u | Cannot send a publish response "
                             "since the publish queue is empty", sub->subscriptionID)
        if(sub->state != UA_SUBSCRIPTIONSTATE_LATE) {
            sub->state = UA_SUBSCRIPTIONSTATE_LATE;
        } else {
            ++sub->currentLifetimeCount;
            if(sub->currentLifetimeCount > sub->lifeTimeCount) {
                UA_LOG_DEBUG_SESSION(server->config.logger, sub->session, "Subscription %u | "
                                     "End of lifetime for subscription", sub->subscriptionID);
                UA_Session_deleteSubscription(server, sub->session, sub->subscriptionID);
            }
        }
        return;
    }

    UA_PublishResponse *response = &pre->response;
    UA_NotificationMessage *message = &response->notificationMessage;
    UA_NotificationMessageEntry *retransmission = NULL;
    if(notifications > 0) {
        /* Allocate the retransmission entry */
        retransmission = UA_malloc(sizeof(UA_NotificationMessageEntry));
        if(!retransmission) {
            UA_LOG_WARNING_SESSION(server->config.logger, sub->session,
                                   "Subscription %u | Could not allocate memory "
                                   "for retransmission", sub->subscriptionID);
            return;
        }
        /* Prepare the response */
        UA_StatusCode retval =
            prepareNotificationMessage(sub, message, notifications);
        if(retval != UA_STATUSCODE_GOOD) {
            UA_LOG_WARNING_SESSION(server->config.logger, sub->session,
                                   "Subscription %u | Could not prepare the "
                                   "notification message", sub->subscriptionID);
            UA_free(retransmission);
            return;
        }
    }

    /* <-- The point of no return --> */

    /* Remove the response from the response queue */
    SIMPLEQ_REMOVE_HEAD(&sub->session->responseQueue, listEntry);

    /* Set up the response */
    response->responseHeader.timestamp = UA_DateTime_now();
    response->subscriptionId = sub->subscriptionID;
    response->moreNotifications = moreNotifications;
    message->publishTime = response->responseHeader.timestamp;
    if(notifications == 0) {
        /* Send sequence number for the next notification */
        message->sequenceNumber = sub->sequenceNumber + 1;
    } else {
        /* Increase the sequence number */
        message->sequenceNumber = ++sub->sequenceNumber;

        /* Put the notification message into the retransmission queue. This needs to
         * be done here, so that the message itself is included in the available
         * sequence numbers for acknowledgement. */
        retransmission->message = response->notificationMessage;
        UA_Subscription_addRetransmissionMessage(server, sub, retransmission);
    }

    /* Get the available sequence numbers from the retransmission queue */
    size_t available = sub->retransmissionQueueSize;
    if(available > 0) {
        response->availableSequenceNumbers = UA_alloca(available * sizeof(UA_UInt32));
        response->availableSequenceNumbersSize = available;
        size_t i = 0;
        UA_NotificationMessageEntry *nme;
        TAILQ_FOREACH(nme, &sub->retransmissionQueue, listEntry) {
            response->availableSequenceNumbers[i] = nme->message.sequenceNumber;
            ++i;
        }
    }

    /* Send the response */
    UA_LOG_DEBUG_SESSION(server->config.logger, sub->session,
                         "Subscription %u | Sending out a publish response with %u "
                         "notifications", sub->subscriptionID, (UA_UInt32)notifications);
    UA_SecureChannel_sendBinaryMessage(sub->session->channel, pre->requestId, response,
                                       &UA_TYPES[UA_TYPES_PUBLISHRESPONSE]);

    /* Reset subscription state to normal. */
    sub->state = UA_SUBSCRIPTIONSTATE_NORMAL;
    sub->currentKeepAliveCount = 0;
    sub->currentLifetimeCount = 0;

    /* Free the response */
    UA_Array_delete(response->results, response->resultsSize,
                    &UA_TYPES[UA_TYPES_UINT32]);
    UA_free(pre); /* no need for UA_PublishResponse_deleteMembers */

    /* Repeat if there are more notifications to send */
    if(moreNotifications)
        UA_Subscription_publishCallback(server, sub);
}